

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O3

void Sdm_ManTest(void)

{
  Sdm_Man_t *p;
  int pCut [7];
  int aiStack_38 [10];
  
  aiStack_38[4] = 0x28;
  aiStack_38[5] = 0;
  aiStack_38[6] = 0;
  aiStack_38[0] = 4;
  aiStack_38[1] = 10;
  aiStack_38[2] = 0x14;
  aiStack_38[3] = 0x1e;
  p = (Sdm_Man_t *)calloc(1,0x1a60);
  Sdm_ManPrecomputePerms(p);
  Sdm_ManComputeFunc(p,4,6,aiStack_38,0x3f23f,0);
  Sdm_ManFree(p);
  return;
}

Assistant:

void Sdm_ManTest()
{
    Sdm_Man_t * p;
    int iDsd0 = 4;
    int iDsd1 = 6;
    int iDsd;
    int uMask = 0x3FFFF ^ ((7 ^ 0) << 6) ^ ((7 ^ 1) << 9);
    int pCut[7] = { 4, 10, 20, 30, 40 };
//    Sdm_ManPrintPerm( uMask );
    p = Sdm_ManAlloc();
    iDsd = Sdm_ManComputeFunc( p, iDsd0, iDsd1, pCut, uMask, 0 );
    Sdm_ManFree( p );
}